

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int use_privatekey_blob(SSL_CTX *ctx,curl_blob *blob,int type,char *key_passwd)

{
  int iVar1;
  BIO *bp;
  EVP_PKEY *pkey;
  
  bp = BIO_new_mem_buf(blob->data,(int)blob->len);
  if (bp == (BIO *)0x0) {
    return 0x1b;
  }
  if (type == 2) {
    pkey = d2i_PrivateKey_bio(bp,(EVP_PKEY **)0x0);
  }
  else {
    iVar1 = 0;
    if (type != 1) goto LAB_0017486b;
    pkey = PEM_read_bio_PrivateKey(bp,(EVP_PKEY **)0x0,passwd_callback,key_passwd);
  }
  iVar1 = 0;
  if (pkey != (EVP_PKEY *)0x0) {
    iVar1 = SSL_CTX_use_PrivateKey((SSL_CTX *)ctx,pkey);
    EVP_PKEY_free(pkey);
  }
LAB_0017486b:
  BIO_free(bp);
  return iVar1;
}

Assistant:

static int use_privatekey_blob(SSL_CTX *ctx, const struct curl_blob *blob,
                               int type, const char *key_passwd)
{
  int ret = 0;
  EVP_PKEY *pkey = NULL;
  BIO *in = BIO_new_mem_buf(blob->data, (int)(blob->len));
  if(!in)
    return CURLE_OUT_OF_MEMORY;

  if(type == SSL_FILETYPE_PEM)
    pkey = PEM_read_bio_PrivateKey(in, NULL, passwd_callback,
                                   CURL_UNCONST(key_passwd));
  else if(type == SSL_FILETYPE_ASN1)
    pkey = d2i_PrivateKey_bio(in, NULL);
  else
    goto end;

  if(!pkey)
    goto end;

  ret = SSL_CTX_use_PrivateKey(ctx, pkey);
  EVP_PKEY_free(pkey);
end:
  BIO_free(in);
  return ret;
}